

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strduptrim.c
# Opt level: O1

char * host_strduptrim(char *s)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  ushort *in_RAX;
  ushort **ppuVar4;
  char *pcVar5;
  int iVar6;
  byte *__s;
  
  if (*s != '[') {
LAB_00110aec:
    pcVar5 = dupstr(s);
    return pcVar5;
  }
  pbVar1 = (byte *)(s + 1);
  iVar6 = 0;
  __s = pbVar1;
LAB_00110a69:
  bVar2 = *__s;
  if ((bVar2 == 0) || (bVar2 == 0x5d)) goto LAB_00110aad;
  ppuVar4 = __ctype_b_loc();
  in_RAX = *ppuVar4;
  if ((*(byte *)((long)in_RAX + (ulong)bVar2 * 2 + 1) & 0x10) == 0) {
    if ((ulong)bVar2 != 0x3a) {
      if (bVar2 == 0x25) {
        in_RAX = (ushort *)strcspn((char *)__s,"]");
        __s = __s + (long)in_RAX;
      }
LAB_00110aad:
      bVar3 = true;
      if (*__s == 0x5d) {
        in_RAX = (ushort *)CONCAT71((int7)((ulong)in_RAX >> 8),__s[1] == 0);
        if (1 < iVar6 && __s[1] == 0) {
          bVar3 = false;
          in_RAX = (ushort *)dupprintf("%.*s",(ulong)(uint)((int)__s - (int)pbVar1),pbVar1);
        }
      }
      if (!bVar3) {
        return (char *)in_RAX;
      }
      goto LAB_00110aec;
    }
    iVar6 = iVar6 + 1;
  }
  __s = __s + 1;
  goto LAB_00110a69;
}

Assistant:

char *host_strduptrim(const char *s)
{
    if (s[0] == '[') {
        const char *p = s+1;
        int colons = 0;
        while (*p && *p != ']') {
            if (isxdigit((unsigned char)*p))
                /* OK */;
            else if (*p == ':')
                colons++;
            else
                break;
            p++;
        }
        if (*p == '%') {
            /*
             * This delimiter character introduces an RFC 4007 scope
             * id suffix (e.g. suffixing the address literal with
             * %eth1 or %2 or some such). There's no syntax
             * specification for the scope id, so just accept anything
             * except the closing ].
             */
            p += strcspn(p, "]");
        }
        if (*p == ']' && !p[1] && colons > 1) {
            /*
             * This looks like an IPv6 address literal (hex digits and
             * at least two colons, plus optional scope id, contained
             * in square brackets). Trim off the brackets.
             */
            return dupprintf("%.*s", (int)(p - (s+1)), s+1);
        }
    }

    /*
     * Any other shape of string is simply duplicated.
     */
    return dupstr(s);
}